

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferParamValueIntToFloatConversion.cpp
# Opt level: O1

string * __thiscall
glcts::TextureBufferParamValueIntToFloatConversion::getComputeShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferParamValueIntToFloatConversion *this)

{
  ostream *poVar1;
  stringstream result;
  stringstream asStack_198 [16];
  undefined1 local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nprecision highp float;\n\nuniform highp samplerBuffer sampler_buffer;\n\nlayout(std430) buffer ComputeSSBO\n{\n    float value[];\n} computeSSBO;\n\nlayout (local_size_x = "
             ,0xca);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_188);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", local_size_y = ",0x11);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             ") in;\n\nvoid main(void)\n{\n    int index = int(gl_LocalInvocationID.x * gl_WorkGroupSize.y + gl_LocalInvocationID.y);\n\n    computeSSBO.value[index] = texelFetch( sampler_buffer, index ).x;\n}\n"
             ,0xbd);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base((ios_base *)(local_188 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferParamValueIntToFloatConversion::getComputeShaderCode()
{
	std::stringstream result;

	result << "${VERSION}\n"
			  "\n"
			  "${TEXTURE_BUFFER_REQUIRE}\n"
			  "\n"
			  "precision highp float;\n"
			  "\n"
			  "uniform highp samplerBuffer sampler_buffer;\n"
			  "\n"
			  "layout(std430) buffer ComputeSSBO\n"
			  "{\n"
			  "    float value[];\n"
			  "} computeSSBO;\n"
			  "\n"
			  "layout (local_size_x = "
		   << m_work_group_x_size << ", local_size_y = " << m_work_group_y_size
		   << ") in;\n"
			  "\n"
			  "void main(void)\n"
			  "{\n"
			  "    int index = int(gl_LocalInvocationID.x * gl_WorkGroupSize.y + gl_LocalInvocationID.y);\n"
			  "\n"
			  "    computeSSBO.value[index] = texelFetch( sampler_buffer, index ).x;\n"
			  "}\n";

	return result.str();
}